

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

bool __thiscall
libchars::command_cursor::subword(command_cursor *this,filter_t mask,bool ignore_hidden)

{
  bool bVar1;
  command_node *pcVar2;
  
  bVar1 = valid(this);
  if (((bVar1) && (pcVar2 = current(this), (pcVar2->mask & mask) != 0)) &&
     (pcVar2 = current(this), (byte)(pcVar2->hidden ^ 1U | ignore_hidden) == 1)) {
    pcVar2 = current(this);
    return pcVar2->start != (command_node *)0x0;
  }
  return false;
}

Assistant:

bool command_cursor::subword(command::filter_t mask, bool ignore_hidden) const
    {
        return valid() &&
               (current()->mask & mask) != 0 &&
               (!current()->hidden || ignore_hidden) &&
               current()->start != NULL;
    }